

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifSelect.c
# Opt level: O3

void If_ObjConePrint_rec(If_Man_t *pIfMan,If_Obj_t *pIfObj,Vec_Ptr_t *vVisited)

{
  uint uVar1;
  int iVar2;
  void **ppvVar3;
  ulong uVar4;
  
  if ((pIfObj->CutBest).Area == 0.0) {
    uVar1 = vVisited->nSize;
    if (uVar1 == vVisited->nCap) {
      if ((int)uVar1 < 0x10) {
        if (vVisited->pArray == (void **)0x0) {
          ppvVar3 = (void **)malloc(0x80);
        }
        else {
          ppvVar3 = (void **)realloc(vVisited->pArray,0x80);
        }
        vVisited->pArray = ppvVar3;
        vVisited->nCap = 0x10;
      }
      else {
        if (vVisited->pArray == (void **)0x0) {
          ppvVar3 = (void **)malloc((ulong)uVar1 << 4);
        }
        else {
          ppvVar3 = (void **)realloc(vVisited->pArray,(ulong)uVar1 << 4);
        }
        vVisited->pArray = ppvVar3;
        vVisited->nCap = uVar1 * 2;
      }
    }
    else {
      ppvVar3 = vVisited->pArray;
    }
    iVar2 = vVisited->nSize;
    vVisited->nSize = iVar2 + 1;
    ppvVar3[iVar2] = &pIfObj->CutBest;
    (pIfObj->CutBest).Area = -NAN;
    if (((undefined1  [112])*pIfObj & (undefined1  [112])0xf) != (undefined1  [112])0x2) {
      if (pIfObj->pEquiv != (If_Obj_t *)0x0) {
        If_ObjConePrint_rec(pIfMan,pIfObj->pEquiv,vVisited);
      }
      If_ObjConePrint_rec(pIfMan,pIfObj->pFanin0,vVisited);
      If_ObjConePrint_rec(pIfMan,pIfObj->pFanin1,vVisited);
      if (pIfObj->pEquiv == (If_Obj_t *)0x0) {
        uVar4 = 0;
      }
      else {
        uVar4 = (ulong)(uint)pIfObj->pEquiv->Id;
      }
      printf("%5d = %5d & %5d | %5d\n",(ulong)(uint)pIfObj->Id,(ulong)(uint)pIfObj->pFanin0->Id,
             (ulong)(uint)pIfObj->pFanin1->Id,uVar4);
      return;
    }
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Prints the logic cone with choices.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void If_ObjConePrint_rec( If_Man_t * pIfMan, If_Obj_t * pIfObj, Vec_Ptr_t * vVisited )
{
    If_Cut_t * pCut;
    pCut = If_ObjCutBest(pIfObj);
    if ( If_CutDataInt(pCut) )
        return;
    Vec_PtrPush( vVisited, pCut );
    // insert the worst case
    If_CutSetDataInt( pCut, ~0 );
    // skip in case of primary input
    if ( If_ObjIsCi(pIfObj) )
        return;
    // compute the functions of the children
    if ( pIfObj->pEquiv ) 
    If_ObjConePrint_rec( pIfMan, pIfObj->pEquiv, vVisited );
    If_ObjConePrint_rec( pIfMan, pIfObj->pFanin0, vVisited );
    If_ObjConePrint_rec( pIfMan, pIfObj->pFanin1, vVisited );
    printf( "%5d = %5d & %5d | %5d\n", pIfObj->Id, pIfObj->pFanin0->Id, pIfObj->pFanin1->Id, pIfObj->pEquiv ? pIfObj->pEquiv->Id : 0 );
}